

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

lws * lws_client_connect_via_info(lws_client_connect_info *i)

{
  undefined1 *puVar1;
  byte bVar2;
  allocated_headers *paVar3;
  lws *plVar4;
  lws_role_ops *plVar5;
  int iVar6;
  lws_context *plVar7;
  lws_log_cx *plVar8;
  ulong uVar9;
  lws_protocols *plVar10;
  char *pcVar11;
  lws **pplVar12;
  lws *plVar13;
  char cVar14;
  uint16_t uVar15;
  ulong uVar16;
  uint16_t uVar17;
  lws_retry_bo_t *plVar18;
  lws_context *obj;
  char *pcVar19;
  code *prep;
  uint uVar20;
  lws_vhost *vh;
  void *pvVar21;
  char *cce;
  undefined4 uVar22;
  char *local_80;
  char *local_78;
  char *local_70;
  char *pcStack_68;
  char *local_60;
  char *pcStack_58;
  char *local_50;
  char *local_48;
  char *local_40;
  
  plVar7 = i->context;
  if ((*(ushort *)&plVar7->field_0x7b7 & 0x20) != 0) {
    return (lws *)0x0;
  }
  pcVar11 = i->protocol;
  if ((*(ushort *)&plVar7->field_0x7b7 & 0x40) == 0) {
    iVar6 = lws_protocol_init(plVar7);
    if (iVar6 != 0) {
      return (lws *)0x0;
    }
    plVar7 = i->context;
  }
  if (i->local_protocol_name != (char *)0x0) {
    pcVar11 = i->local_protocol_name;
  }
  iVar6 = lws_pthread_self_to_tsi(plVar7);
  if (iVar6 < 0) {
    __assert_fail("tsi >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core-net/client/connect.c"
                  ,0x9d,
                  "struct lws *lws_client_connect_via_info(const struct lws_client_connect_info *)")
    ;
  }
  plVar7 = (lws_context *)__lws_wsi_create_with_role(i->context,iVar6,(lws_role_ops *)0x0,i->log_cx)
  ;
  if (plVar7 == (lws_context *)0x0) {
    return (lws *)0x0;
  }
  vh = i->vhost;
  if (vh == (lws_vhost *)0x0) {
    vh = i->context->vhost_list;
    if (vh != (lws_vhost *)0x0) {
      iVar6 = strcmp(vh->name,"system");
      if (iVar6 == 0) {
        vh = vh->vhost_next;
      }
      goto LAB_0013898a;
    }
    plVar8 = lwsl_context_get_cx(i->context);
    obj = i->context;
    prep = lws_log_prepend_context;
    pcVar11 = "no vhost";
LAB_00138c4f:
    _lws_log_cx(plVar8,prep,obj,1,"lws_client_connect_via_info",pcVar11);
  }
  else {
LAB_0013898a:
    uVar9 = *(ulong *)((long)&plVar7->lcg[0].owner.tail + 6);
    *(ulong *)((long)&plVar7->lcg[0].owner.tail + 6) = uVar9 | 0x8000000000000000;
    uVar15 = (uint16_t)*(undefined4 *)&i->keep_warm_secs;
    uVar17 = 5;
    if (uVar15 != 0) {
      uVar17 = uVar15;
    }
    *(uint16_t *)&plVar7->lcg[0].ordinal = uVar17;
    plVar7->pt[0].sul_plat.list.owner = (lws_dll2_owner *)i->seq;
    uVar20 = i->ssl_connection;
    *(uint *)&(plVar7->sul_system_state).field_0x2c = uVar20;
    *(uint8_t *)((long)&plVar7->lcg[0].tag_prefix + 6) = i->priority;
    plVar18 = i->retry_and_idle_policy;
    if (plVar18 == (lws_retry_bo_t *)0x0) {
      plVar18 = &i->context->default_retry;
    }
    plVar7->pt[0].sul_plat.us = (lws_usec_t)plVar18;
    if ((uVar20 >> 0x13 & 1) != 0) {
      *(ulong *)((long)&plVar7->lcg[0].owner.tail + 6) = uVar9 | 0x8000080000000000;
    }
    lws_vhost_bind_wsi(vh,(lws *)plVar7);
    if (((lws_a *)plVar7->canonical_hostname)->vhost == (lws_vhost *)0x0) {
      plVar8 = lwsl_wsi_get_cx((lws *)plVar7);
      pcVar11 = "No vhost in the context";
LAB_00138c2a:
      prep = lws_log_prepend_wsi;
      obj = plVar7;
      goto LAB_00138c4f;
    }
    iVar6 = lws_role_call_client_bind((lws *)plVar7,i);
    plVar8 = lwsl_wsi_get_cx((lws *)plVar7);
    if (iVar6 < 0) {
      pcVar11 = "unable to bind to role";
      goto LAB_00138c2a;
    }
    pvVar21 = (void *)0x0;
    _lws_log_cx(plVar8,lws_log_prepend_wsi,plVar7,8,"lws_client_connect_via_info",
                "role binding to %s",((lws_role_ops *)plVar7->pt[0].sul_plat.list.next)->name);
    *(void **)plVar7->pt[0].dummy_pipe_fds = (void *)0x0;
    *(char *)((long)&plVar7->lcg[0].ordinal + 4) = '\0';
    *(int *)((long)&(plVar7->sul_system_state).cb + 4) = -1;
    uVar17 = (uint16_t)i->port;
    *(uint16_t *)((long)&plVar7->lcg[0].owner.count + 2) = uVar17;
    *(uint16_t *)&plVar7->lcg[0].owner.count = uVar17;
    *(uint8_t *)((long)&plVar7->lcg[0].tag_prefix + 5) = i->sys_tls_client_cert;
    *(int *)&plVar7->system_blobs[3].u = i->manual_initial_tx_credit;
    ((lws_a *)plVar7->canonical_hostname)->protocol =
         ((lws_a *)plVar7->canonical_hostname)->vhost->protocols;
    uVar9 = *(ulong *)((long)&plVar7->lcg[0].owner.tail + 6);
    uVar16 = (ulong)(*(ushort *)((long)&i->ssl_connection + 2) & 1) << 0x39;
    *(ulong *)((long)&plVar7->lcg[0].owner.tail + 6) = uVar9 & 0xfdffffffffffffff | uVar16;
    uVar9 = uVar9 & 0xbdffffffffffffff | uVar16 |
            (ulong)((uint)i->ssl_connection >> 0xc & 1) << 0x3e;
    *(ulong *)((long)&plVar7->lcg[0].owner.tail + 6) = uVar9;
    if (i->userdata != (void *)0x0) {
      *(ulong *)((long)&plVar7->lcg[0].owner.tail + 6) = uVar9 | 0x800;
      pvVar21 = i->userdata;
      *(void **)plVar7->pt[0].dummy_pipe_fds = pvVar21;
    }
    if (pcVar11 != (char *)0x0) {
      plVar8 = lwsl_wsi_get_cx((lws *)plVar7);
      pcVar19 = pcVar11;
      _lws_log_cx(plVar8,lws_log_prepend_wsi,plVar7,8,"lws_client_connect_via_info",
                  "vh %s protocol binding to %s\n",
                  ((lws_a *)plVar7->canonical_hostname)->vhost->name,pcVar11);
      plVar10 = lws_vhost_name_to_protocol(((lws_a *)plVar7->canonical_hostname)->vhost,pcVar11);
      if (plVar10 == (lws_protocols *)0x0) {
        plVar8 = lwsl_wsi_get_cx((lws *)plVar7);
        _lws_log_cx(plVar8,lws_log_prepend_wsi,plVar7,8,"lws_client_connect_via_info",
                    "unknown protocol %s",pcVar11,pcVar19);
      }
      else {
        lws_bind_protocol((lws *)plVar7,plVar10,"lws_client_connect_via_info");
      }
      plVar8 = lwsl_wsi_get_cx((lws *)plVar7);
      pcVar11 = lws_wsi_tag((lws *)plVar7);
      plVar10 = ((lws_a *)plVar7->canonical_hostname)->protocol;
      if (plVar10 == (lws_protocols *)0x0) {
        pcVar19 = "none";
      }
      else {
        pcVar19 = plVar10->name;
      }
      _lws_log_cx(plVar8,lws_log_prepend_wsi,plVar7,8,"lws_client_connect_via_info",
                  "%s: %s %s entry",pcVar11,((lws_role_ops *)plVar7->pt[0].sul_plat.list.next)->name
                  ,pcVar19);
      pvVar21 = *(void **)plVar7->pt[0].dummy_pipe_fds;
    }
    if ((pvVar21 == (void *)0x0) && (i->userdata != (void *)0x0)) {
      puVar1 = (undefined1 *)((long)&plVar7->lcg[0].owner.tail + 7);
      *puVar1 = *puVar1 | 8;
      *(void **)plVar7->pt[0].dummy_pipe_fds = i->userdata;
    }
    *(int *)&(plVar7->default_retry).jitter_percent = i->ssl_connection;
    local_78 = i->address;
    local_70 = i->path;
    pcStack_68 = i->host;
    local_60 = i->origin;
    pcStack_58 = i->protocol;
    local_50 = i->method;
    local_48 = i->iface;
    local_40 = i->alpn;
    iVar6 = lws_client_stash_create((lws *)plVar7,&local_78);
    if (iVar6 == 0) {
      if (i->alpn != (char *)0x0) {
        lws_strncpy((char *)&plVar7->sul_system_state,i->alpn,0x18);
      }
      paVar3 = (allocated_headers *)i->opaque_user_data;
      ((plVar7->pt[0].fake_wsi)->http).ah = paVar3;
      ((lws_a *)plVar7->canonical_hostname)->opaque_user_data = paVar3;
      pcVar11 = i->address;
      pcVar19 = "WS";
      if (i->method != (char *)0x0) {
        pcVar19 = i->method;
      }
      plVar13 = (lws *)0x0;
      __lws_lc_tag(i->context,i->context->lcg + 4,
                   (lws_lifecycle_t *)((long)&plVar7->system_blobs[3].u + 8),"%s/%s/%s",pcVar19,
                   ((lws_role_ops *)plVar7->pt[0].sul_plat.list.next)->name,pcVar11);
      uVar22 = (undefined4)((ulong)pcVar11 >> 0x20);
      if (i->parent_wsi != (lws *)0x0) {
        plVar8 = lwsl_wsi_get_cx((lws *)plVar7);
        pcVar11 = lws_wsi_tag(i->parent_wsi);
        _lws_log_cx(plVar8,lws_log_prepend_wsi,plVar7,8,"lws_client_connect_via_info",
                    "created as child %s",pcVar11);
        uVar22 = (undefined4)((ulong)pcVar11 >> 0x20);
        plVar4 = i->parent_wsi;
        *(lws **)((lws_sockaddr46 *)&plVar7->pt[0].sul_tls + 2) = plVar4;
        plVar13 = plVar4->child_list;
        plVar7->pt[0].sul_plat.list.prev = (lws_dll2 *)plVar13;
        plVar4->child_list = (lws *)plVar7;
      }
      plVar5 = (lws_role_ops *)plVar7->pt[0].sul_plat.list.next;
      bVar2 = plVar5->rops_idx[9];
      if (0xf < bVar2) {
        uVar20 = 0;
        iVar6 = (*plVar5->rops_table[(bVar2 >> 4) - 1].check_upgrades)((lws *)plVar7);
        if (iVar6 != 0) {
          uVar20 = 2;
          if (i->parent_wsi != (lws *)0x0) {
            i->parent_wsi->child_list = plVar13;
          }
        }
        uVar9 = 3;
        if (-1 < iVar6) {
          uVar9 = (ulong)uVar20;
        }
        plVar13 = (lws *)(*(code *)(&DAT_0014b3dc + *(int *)(&DAT_0014b3dc + uVar9 * 4)))();
        return plVar13;
      }
      if (i->pwsi != (lws **)0x0) {
        *i->pwsi = (lws *)plVar7;
      }
      if (((lws_role_ops *)plVar7->pt[0].sul_plat.list.next != &role_ops_raw_skt) ||
         ((i->local_protocol_name != (char *)0x0 &&
          (iVar6 = strcmp(i->local_protocol_name,"raw-proxy"), iVar6 == 0)))) {
        plVar8 = lwsl_wsi_get_cx((lws *)plVar7);
        plVar5 = (lws_role_ops *)plVar7->pt[0].sul_plat.list.next;
        _lws_log_cx(plVar8,lws_log_prepend_wsi,plVar7,0x10,"lws_client_connect_via_info",
                    "adoption cb %d to %s %s",CONCAT44(uVar22,(uint)plVar5->adoption_cb[0]),
                    plVar5->name,((lws_a *)plVar7->canonical_hostname)->protocol->name);
        (*((lws_a *)plVar7->canonical_hostname)->protocol->callback)
                  ((lws *)plVar7,
                   (lws_callback_reasons)
                   ((lws_role_ops *)plVar7->pt[0].sul_plat.list.next)->adoption_cb[0],
                   *(void **)plVar7->pt[0].dummy_pipe_fds,(void *)0x0,0);
      }
      if ((i->method != (char *)0x0) && (iVar6 = strcmp(i->method,"RAW"), iVar6 == 0)) {
        ((lws_lws_tls *)&plVar7->pt[0].http.ah_wait_list_length)->ssl = (lws_tls_conn *)0x0;
        if ((*(uint *)&(plVar7->default_retry).jitter_percent & 1) != 0) {
          local_80 = (char *)0x0;
          iVar6 = lws_client_create_tls((lws *)plVar7,&local_80,1);
          cVar14 = (iVar6 != 0) * '\x05';
          if (iVar6 == 1) {
            cVar14 = '\x01';
          }
          if (cVar14 == '\x05') {
            plVar8 = lwsl_wsi_get_cx((lws *)plVar7);
            _lws_log_cx(plVar8,lws_log_prepend_wsi,plVar7,8,"lws_client_connect_via_info",
                        "tls start fail");
            lws_close_free_wsi((lws *)plVar7,LWS_CLOSE_STATUS_NOSTATUS,"tls start fail");
            pplVar12 = i->pwsi;
            if (pplVar12 == (lws **)0x0) {
              return (lws *)0x0;
            }
            goto LAB_00138dc6;
          }
          if (cVar14 != '\0') {
            return (lws *)plVar7;
          }
        }
        plVar7 = (lws_context *)lws_http_client_connect_via_info2((lws *)plVar7);
        if (plVar7 == (lws_context *)0x0) {
          return (lws *)0x0;
        }
      }
      puVar1 = (undefined1 *)((long)&plVar7->lcg[0].owner.tail + 6);
      *(ulong *)puVar1 = *(ulong *)puVar1 & 0x7fffffffffffffff;
      return (lws *)plVar7;
    }
  }
  if ((((lws_lws_tls *)&plVar7->pt[0].http.ah_wait_list_length)->ssl != (lws_tls_conn *)0x0) &&
     (((ulong)plVar7->lcg[0].owner.head & 0x100000000) != 0)) {
    lws_tls_restrict_return(i->context);
  }
  lws_realloc(plVar7->pt[0].fake_wsi,0,"free");
  plVar7->pt[0].fake_wsi = (lws *)0x0;
  lws_realloc(plVar7,0,"lws_free");
  pplVar12 = i->pwsi;
  if (pplVar12 == (lws **)0x0) {
    return (lws *)0x0;
  }
LAB_00138dc6:
  *pplVar12 = (lws *)0x0;
  return (lws *)0x0;
}

Assistant:

struct lws *
lws_client_connect_via_info(const struct lws_client_connect_info *i)
{
	const char *local = i->protocol;
	struct lws *wsi, *safe = NULL;
	const struct lws_protocols *p;
	const char *cisin[CIS_COUNT];
	struct lws_vhost *vh;
	int tsi;

	if (i->context->requested_stop_internal_loops)
		return NULL;

	if (!i->context->protocol_init_done)
		if (lws_protocol_init(i->context))
			return NULL;

	/*
	 * If we have .local_protocol_name, use it to select the local protocol
	 * handler to bind to.  Otherwise use .protocol if http[s].
	 */
	if (i->local_protocol_name)
		local = i->local_protocol_name;

	lws_context_lock(i->context, __func__);
	/*
	 * PHASE 1: if SMP, find out the tsi related to current service thread
	 */

	tsi = lws_pthread_self_to_tsi(i->context);
	assert(tsi >= 0);

	/* PHASE 2: create a bare wsi */

	wsi = __lws_wsi_create_with_role(i->context, tsi, NULL, i->log_cx);
	lws_context_unlock(i->context);
	if (wsi == NULL)
		return NULL;

	vh = i->vhost;
	if (!vh) {
#if defined(LWS_WITH_TLS_JIT_TRUST)
		if (lws_tls_jit_trust_vhost_bind(i->context, i->address, &vh))
#endif
		{
			vh = i->context->vhost_list;

			if (!vh) { /* coverity */
				lwsl_cx_err(i->context, "no vhost");
				goto bail;
			}
			if (!strcmp(vh->name, "system"))
				vh = vh->vhost_next;
		}
	}

#if defined(LWS_WITH_SECURE_STREAMS)
	/* any of these imply we are a client wsi bound to an SS, which
	 * implies our opaque user ptr is the ss (or sspc if PROXY_LINK) handle
	 */
	wsi->for_ss = !!(i->ssl_connection & (LCCSCF_SECSTREAM_CLIENT | LCCSCF_SECSTREAM_PROXY_LINK | LCCSCF_SECSTREAM_PROXY_ONWARD));
	wsi->client_bound_sspc = !!(i->ssl_connection & LCCSCF_SECSTREAM_PROXY_LINK); /* so wsi close understands need to remove sspc ptr to wsi */
	wsi->client_proxy_onward = !!(i->ssl_connection & LCCSCF_SECSTREAM_PROXY_ONWARD);
#endif

#if defined(LWS_WITH_SYS_FAULT_INJECTION)
	wsi->fic.name = "wsi";
	if (i->fic.fi_owner.count)
		/*
		 * This moves all the lws_fi_t from i->fi to the vhost fi,
		 * leaving it empty
		 */
		lws_fi_import(&wsi->fic, &i->fic);

	lws_fi_inherit_copy(&wsi->fic, &i->context->fic, "wsi", i->fi_wsi_name);

	if (lws_fi(&wsi->fic, "createfail"))
		goto bail;

#if defined(LWS_WITH_SECURE_STREAMS)
#if defined(LWS_WITH_SECURE_STREAMS_PROXY_API)
	if (wsi->client_bound_sspc) {
		lws_sspc_handle_t *fih = (lws_sspc_handle_t *)i->opaque_user_data;
		lws_fi_inherit_copy(&wsi->fic, &fih->fic, "wsi", NULL);
	}
#endif
	if (wsi->for_ss) {
		lws_ss_handle_t *fih = (lws_ss_handle_t *)i->opaque_user_data;
		lws_fi_inherit_copy(&wsi->fic, &fih->fic, "wsi", NULL);
	}
#endif
#endif

	lws_wsi_fault_timedclose(wsi);

	/*
	 * Until we exit, we can report connection failure directly to the
	 * caller without needing to call through to protocol CONNECTION_ERROR.
	 */
	wsi->client_suppress_CONNECTION_ERROR = 1;

	if (i->keep_warm_secs)
		wsi->keep_warm_secs = i->keep_warm_secs;
	else
		wsi->keep_warm_secs = 5;

	wsi->seq = i->seq;
	wsi->flags = i->ssl_connection;

	wsi->c_pri = i->priority;

	if (i->retry_and_idle_policy)
		wsi->retry_policy = i->retry_and_idle_policy;
	else
		wsi->retry_policy = &i->context->default_retry;

	if (i->ssl_connection & LCCSCF_WAKE_SUSPEND__VALIDITY)
		wsi->conn_validity_wakesuspend = 1;

	lws_vhost_bind_wsi(vh, wsi);

#if defined(LWS_WITH_SYS_FAULT_INJECTION)
	/* additionally inerit from vhost we bound to */
	lws_fi_inherit_copy(&wsi->fic, &vh->fic, "wsi", i->fi_wsi_name);
#endif

	if (!wsi->a.vhost) {
		lwsl_wsi_err(wsi, "No vhost in the context");

		goto bail;
	}

	/*
	 * PHASE 3: Choose an initial role for the wsi and do role-specific init
	 *
	 * Note the initial role may not reflect the final role, eg,
	 * we may want ws, but first we have to go through h1 to get that
	 */

	if (lws_role_call_client_bind(wsi, i) < 0) {
		lwsl_wsi_err(wsi, "unable to bind to role");

		goto bail;
	}
	lwsl_wsi_info(wsi, "role binding to %s", wsi->role_ops->name);

	/*
	 * PHASE 4: fill up the wsi with stuff from the connect_info as far as
	 * it can go.  It's uncertain because not only is our connection
	 * going to complete asynchronously, we might have bound to h1 and not
	 * even be able to get ahold of an ah immediately.
	 */

	wsi->user_space = NULL;
	wsi->pending_timeout = NO_PENDING_TIMEOUT;
	wsi->position_in_fds_table = LWS_NO_FDS_POS;
	wsi->ocport = wsi->c_port = (uint16_t)(unsigned int)i->port;
	wsi->sys_tls_client_cert = i->sys_tls_client_cert;

#if defined(LWS_ROLE_H2)
	wsi->txc.manual_initial_tx_credit =
			(int32_t)i->manual_initial_tx_credit;
#endif

	wsi->a.protocol = &wsi->a.vhost->protocols[0];
	wsi->client_pipeline = !!(i->ssl_connection & LCCSCF_PIPELINE);
	wsi->client_no_follow_redirect = !!(i->ssl_connection &
					    LCCSCF_HTTP_NO_FOLLOW_REDIRECT);

	/*
	 * PHASE 5: handle external user_space now, generic alloc is done in
	 * role finalization
	 */

	if (i->userdata) {
		wsi->user_space_externally_allocated = 1;
		wsi->user_space = i->userdata;
	}

	if (local) {
		lwsl_wsi_info(wsi, "vh %s protocol binding to %s\n",
				wsi->a.vhost->name, local);
		p = lws_vhost_name_to_protocol(wsi->a.vhost, local);
		if (p)
			lws_bind_protocol(wsi, p, __func__);
		else
			lwsl_wsi_info(wsi, "unknown protocol %s", local);

		lwsl_wsi_info(wsi, "%s: %s %s entry",
			    lws_wsi_tag(wsi), wsi->role_ops->name,
			    wsi->a.protocol ? wsi->a.protocol->name : "none");
	}

	/*
	 * PHASE 5: handle external user_space now, generic alloc is done in
	 * role finalization
	 */

	if (!wsi->user_space && i->userdata) {
		wsi->user_space_externally_allocated = 1;
		wsi->user_space = i->userdata;
	}

#if defined(LWS_WITH_TLS)
	wsi->tls.use_ssl = (unsigned int)i->ssl_connection;
#else
	if (i->ssl_connection & LCCSCF_USE_SSL) {
		lwsl_wsi_err(wsi, "lws not configured for tls");
		goto bail;
	}
#endif

	/*
	 * PHASE 6: stash the things from connect_info that we can't process
	 * right now, eg, if http binding, without an ah.  If h1 and no ah, we
	 * will go on the ah waiting list and process those things later (after
	 * the connect_info and maybe the things pointed to have gone out of
	 * scope)
	 *
	 * However these things are stashed in a generic way at this point,
	 * with no relationship to http or ah
	 */

	cisin[CIS_ADDRESS]	= i->address;
	cisin[CIS_PATH]		= i->path;
	cisin[CIS_HOST]		= i->host;
	cisin[CIS_ORIGIN]	= i->origin;
	cisin[CIS_PROTOCOL]	= i->protocol;
	cisin[CIS_METHOD]	= i->method;
	cisin[CIS_IFACE]	= i->iface;
	cisin[CIS_ALPN]		= i->alpn;

	if (lws_client_stash_create(wsi, cisin))
		goto bail;

#if defined(LWS_WITH_TLS)
	if (i->alpn)
		lws_strncpy(wsi->alpn, i->alpn, sizeof(wsi->alpn));
#endif

	wsi->a.opaque_user_data = wsi->stash->opaque_user_data =
		i->opaque_user_data;

#if defined(LWS_WITH_SECURE_STREAMS)

	if (wsi->for_ss) {
		/* it's related to ss... the options are
		 *
		 * LCCSCF_SECSTREAM_PROXY_LINK  : client SSPC link to proxy
		 * LCCSCF_SECSTREAM_PROXY_ONWARD: proxy's onward connection
		 */
		__lws_lc_tag(i->context, &i->context->lcg[
#if defined(LWS_WITH_SECURE_STREAMS_PROXY_API)
		         i->ssl_connection & LCCSCF_SECSTREAM_PROXY_LINK ? LWSLCG_WSI_SSP_CLIENT :
#if defined(LWS_WITH_SERVER)
		         (i->ssl_connection & LCCSCF_SECSTREAM_PROXY_ONWARD ? LWSLCG_WSI_SSP_ONWARD :
#endif
			  LWSLCG_WSI_CLIENT
#if defined(LWS_WITH_SERVER)
			  )
#endif
		],
#else
				LWSLCG_WSI_CLIENT],
#endif
			&wsi->lc, "%s/%s/%s/(%s)", i->method ? i->method : "WS",
			wsi->role_ops->name, i->address,
#if defined(LWS_WITH_SECURE_STREAMS_PROXY_API)
			wsi->client_bound_sspc ?
				lws_sspc_tag((lws_sspc_handle_t *)i->opaque_user_data) :
#endif
			lws_ss_tag(((lws_ss_handle_t *)i->opaque_user_data)));
	} else
#endif
		__lws_lc_tag(i->context, &i->context->lcg[LWSLCG_WSI_CLIENT], &wsi->lc,
			     "%s/%s/%s", i->method ? i->method : "WS",
			     wsi->role_ops->name, i->address);

	lws_metrics_tag_wsi_add(wsi, "vh", wsi->a.vhost->name);

	/*
	 * at this point user callbacks like
	 * LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER will be interested to
	 * know the parent... eg for proxying we can grab extra headers from
	 * the parent's incoming ah and add them to the child client handshake
	 */

	if (i->parent_wsi) {
		lwsl_wsi_info(wsi, "created as child %s",
			      lws_wsi_tag(i->parent_wsi));
		wsi->parent = i->parent_wsi;
		safe = wsi->sibling_list = i->parent_wsi->child_list;
		i->parent_wsi->child_list = wsi;
	}

	/*
	 * PHASE 7: Do any role-specific finalization processing.  We can still
	 * see important info things via wsi->stash
	 */

	if (lws_rops_fidx(wsi->role_ops, LWS_ROPS_client_bind)) {

		int n = lws_rops_func_fidx(wsi->role_ops, LWS_ROPS_client_bind).
							client_bind(wsi, NULL);

		if (n && i->parent_wsi)
			/* unpick from parent */
			i->parent_wsi->child_list = safe;

		if (n < 0)
			/* we didn't survive, wsi is freed */
			goto bail2;

		if (n)
			/* something else failed, wsi needs freeing */
			goto bail;
	}

	/* let the caller's optional wsi storage have the wsi we created */

	if (i->pwsi)
		*i->pwsi = wsi;

	/* PHASE 8: notify protocol with role-specific connected callback */

	/* raw socket per se doesn't want this... raw socket proxy wants it... */

	if (wsi->role_ops != &role_ops_raw_skt ||
	    (i->local_protocol_name &&
	     !strcmp(i->local_protocol_name, "raw-proxy"))) {
		lwsl_wsi_debug(wsi, "adoption cb %d to %s %s",
			   wsi->role_ops->adoption_cb[0],
			   wsi->role_ops->name, wsi->a.protocol->name);

		wsi->a.protocol->callback(wsi, wsi->role_ops->adoption_cb[0],
				wsi->user_space, NULL, 0);
	}

#if defined(LWS_WITH_HUBBUB)
	if (i->uri_replace_to)
		wsi->http.rw = lws_rewrite_create(wsi, html_parser_cb,
					     i->uri_replace_from,
					     i->uri_replace_to);
#endif

	if (i->method && (!strcmp(i->method, "RAW") // ||
//			  !strcmp(i->method, "MQTT")
	)) {

		/*
		 * Not for MQTT here, since we don't know if we will
		 * pipeline it or not...
		 */

#if defined(LWS_WITH_TLS)

		wsi->tls.ssl = NULL;

		if (wsi->tls.use_ssl & LCCSCF_USE_SSL) {
			const char *cce = NULL;

			switch (
#if !defined(LWS_WITH_SYS_ASYNC_DNS)
			lws_client_create_tls(wsi, &cce, 1)
#else
			lws_client_create_tls(wsi, &cce, 0)
#endif
			) {
			case 1:
				return wsi;
			case 0:
				break;
			default:
				goto bail3;
			}
		}
#endif


		/* fallthru */

		wsi = lws_http_client_connect_via_info2(wsi);
	}

	if (wsi)
		/*
		 * If it subsequently fails, report CONNECTION_ERROR,
		 * because we're going to return a non-error return now.
		 */
		wsi->client_suppress_CONNECTION_ERROR = 0;

	return wsi;

#if defined(LWS_WITH_TLS)
bail3:
	lwsl_wsi_info(wsi, "tls start fail");
	lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "tls start fail");

	if (i->pwsi)
		*i->pwsi = NULL;

	return NULL;
#endif

bail:
#if defined(LWS_WITH_TLS)
	if (wsi->tls.ssl && wsi->tls_borrowed)
		lws_tls_restrict_return(i->context);
#endif

	lws_free_set_NULL(wsi->stash);
	lws_fi_destroy(&wsi->fic);
	lws_free(wsi);
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
bail2:
#endif

	if (i->pwsi)
		*i->pwsi = NULL;

	return NULL;
}